

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> * __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::processMessage
          (OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *__return_storage_ptr__,
          ZlibContext *this,ArrayPtr<const_unsigned_char> message,Maybe<unsigned_long> maxSize,
          bool addNullTerminator)

{
  Detail *pDVar1;
  Detail *pDVar2;
  bool bVar3;
  void **ppvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  Exception *firstElement;
  Exception *pEVar10;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *extraout_RAX;
  long lVar11;
  void *pvVar12;
  undefined4 extraout_var;
  ulong uVar13;
  Exception *pEVar14;
  ulong uVar15;
  Exception *pEVar16;
  uchar *ptrCopy_1;
  Exception *pEVar17;
  size_t elementCount;
  ArrayDisposer *pAVar18;
  size_t sVar19;
  bool _kjCondition;
  Exception *local_1a0;
  Exception *local_198;
  undefined1 local_190 [44];
  int result;
  Exception *local_160;
  ArrayDisposer *local_158;
  Exception *local_150;
  Exception *local_148;
  ArrayDisposer *local_140;
  ZlibContext *local_138;
  Fault f;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> parts;
  ulong local_98;
  Fault f_1;
  NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
  _kj_switch_subject;
  
  (this->ctx).next_in = message.ptr;
  (this->ctx).avail_in = (uInt)message.size_;
  parts.builder.endPtr = (Result *)0x0;
  parts.builder.ptr = (Result *)0x0;
  parts.builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_198 = (Exception *)0x0;
  pEVar14 = (Exception *)0x0;
  local_98 = 0;
  pEVar16 = (Exception *)0x0;
  pAVar18 = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_138 = this;
  do {
    firstElement = (Exception *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (1,0x1000,0x1000,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
    ;
    (local_138->ctx).next_out = (Bytef *)firstElement;
    (local_138->ctx).avail_out = 0x1000;
    result = 0;
    local_140 = pAVar18;
    f_1.exception = firstElement;
    if (local_138->mode == DECOMPRESS) {
      result = inflate(&this->ctx,2);
      _kjCondition = (uint)result < 2 || result == 0xfffffffb;
      if ((1 < (uint)result) && (result != 0xfffffffb)) {
        local_190._0_4_ = 1;
        local_190._8_8_ = local_160;
        local_190._16_8_ = local_150;
        local_190._24_8_ = local_148;
        local_190._32_8_ = local_158;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[21],int&,char_const(&)[13],char*&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xd2f,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END"
                   ,"_kjCondition,\"Decompression failed\", result, \" with reason\", ctx.msg",
                   &_kjCondition,(char (*) [21])"Decompression failed",&result,
                   (char (*) [13])" with reason",&(local_138->ctx).msg);
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_0039e803:
      uVar8 = (local_138->ctx).avail_out;
    }
    else {
      if (local_138->mode == COMPRESS) {
        result = deflate(&this->ctx,2);
        _kjCondition = (uint)result < 2 || result == 0xfffffffb;
        if ((1 < (uint)result) && (result != 0xfffffffb)) {
          local_190._0_4_ = 1;
          local_190._8_8_ = local_160;
          local_190._16_8_ = local_150;
          local_190._24_8_ = local_148;
          local_190._32_8_ = local_158;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[19],int&>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0xd2a,FAILED,
                     "result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END",
                     "_kjCondition,\"Compression failed\", result",&_kjCondition,
                     (char (*) [19])"Compression failed",&result);
          kj::_::Debug::Fault::fatal(&f);
        }
        goto LAB_0039e803;
      }
      uVar8 = 0x1000;
    }
    iVar9 = result;
    sVar19 = 0x1000;
    pEVar17 = pEVar16;
    if (uVar8 == 0x1000) {
      local_1a0 = local_198;
    }
    else {
      if (pEVar14 == pEVar16) {
        lVar11 = (long)pEVar16 - (long)local_198 >> 3;
        uVar13 = lVar11 * -0x3333333333333333;
        uVar15 = lVar11 * -0x6666666666666666;
        if (pEVar16 == local_198) {
          uVar15 = 4;
        }
        local_1a0 = (Exception *)uVar15;
        if (uVar15 <= uVar13 && uVar13 - uVar15 != 0) {
          ppvVar4 = local_198->trace;
          while ((Exception *)(ppvVar4 + uVar15 * 5 + -0xd) < pEVar16) {
            pDVar1 = pEVar14[-1].details.builder.ptr;
            if (pDVar1 != (Detail *)0x0) {
              pEVar14[-1].details.builder.ptr = (Detail *)0x0;
              pEVar14[-1].details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
              pDVar2 = pEVar14[-1].details.builder.endPtr;
              (**(code **)pDVar2->id)(pDVar2,pDVar1,1);
            }
            pEVar14 = (Exception *)&pEVar14[-1].traceCount;
            pEVar16 = pEVar14;
          }
        }
        local_1a0 = (Exception *)
                    kj::_::HeapArrayDisposer::allocateImpl
                              (0x28,0,(size_t)local_1a0,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
        pEVar17 = (Exception *)(local_1a0->trace + uVar15 * 5 + -0xd);
        pEVar14 = local_1a0;
        for (pEVar10 = local_198; pEVar10 != pEVar16; pEVar10 = (Exception *)&pEVar10->description)
        {
          *(int *)&(pEVar14->ownFile).content.ptr = *(int *)&(pEVar10->ownFile).content.ptr;
          ((Array<const_unsigned_char> *)&(pEVar14->ownFile).content.size_)->ptr =
               ((Array<const_unsigned_char> *)&(pEVar10->ownFile).content.size_)->ptr;
          (pEVar14->ownFile).content.disposer = (pEVar10->ownFile).content.disposer;
          pEVar14->file = (char *)pEVar10->file;
          ((Array<const_unsigned_char> *)&(pEVar10->ownFile).content.size_)->ptr = (uchar *)0x0;
          (pEVar10->ownFile).content.disposer = (ArrayDisposer *)0x0;
          *(size_t *)&pEVar14->line = *(size_t *)&pEVar10->line;
          pEVar14 = (Exception *)&pEVar14->description;
        }
        f_1.exception = local_1a0;
        if (local_198 != (Exception *)0x0) {
          (**local_140->_vptr_ArrayDisposer)
                    (local_140,local_198,0x28,
                     ((long)pEVar16 - (long)local_198 >> 3) * -0x3333333333333333);
        }
        local_140 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      }
      else {
        local_1a0 = local_198;
      }
      *(int *)&(pEVar14->ownFile).content.ptr = iVar9;
      ((Array<const_unsigned_char> *)&(pEVar14->ownFile).content.size_)->ptr = (uchar *)firstElement
      ;
      (pEVar14->ownFile).content.disposer = (ArrayDisposer *)0x1000;
      pEVar14->file = (char *)&kj::_::HeapArrayDisposer::instance;
      *(size_t *)&pEVar14->line = 0x1000 - (ulong)uVar8;
      pEVar14 = (Exception *)&pEVar14->description;
      local_98 = local_98 + (0x1000 - (ulong)uVar8);
      if ((((undefined1  [16])maxSize.ptr & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (maxSize.ptr.field_1.value < local_98)) {
        local_190._0_4_ = 2;
        local_190._12_4_ = (undefined4)((ulong)local_160 >> 0x20);
        local_190._8_4_ = 0x3f1;
        local_190._16_8_ = "Message is too large";
        local_190._24_8_ = (Exception *)0x15;
        _kj_switch_subject.field_1.value.tag = 2;
        pEVar16 = local_1a0;
        goto LAB_0039ec35;
      }
      sVar19 = 0;
      firstElement = (Exception *)0x0;
    }
    if ((local_138->ctx).avail_in == 0) {
      if (iVar9 != 1 && (local_138->ctx).avail_out == 0) goto LAB_0039eb66;
      if (iVar9 == 1) goto LAB_0039eb15;
LAB_0039eb1f:
      local_198 = (Exception *)0x0;
      local_158 = local_140;
      local_160 = local_1a0;
      bVar3 = false;
      pEVar16 = (Exception *)0x0;
      pEVar10 = (Exception *)0x0;
      local_150 = pEVar14;
      local_148 = pEVar17;
    }
    else {
      if (iVar9 == 1) {
LAB_0039eb15:
        reset(local_138);
        goto LAB_0039eb1f;
      }
LAB_0039eb66:
      bVar3 = true;
      local_198 = local_1a0;
      pEVar16 = pEVar14;
      pEVar10 = pEVar17;
    }
    pEVar17 = pEVar10;
    pEVar14 = pEVar16;
    if (firstElement != (Exception *)0x0) {
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,1,sVar19,
                 sVar19,(_func_void_void_ptr *)0x0);
    }
    pEVar16 = pEVar17;
    pAVar18 = local_140;
  } while (bVar3);
  local_190._0_4_ = 1;
  local_190._8_8_ = local_160;
  local_190._16_8_ = local_150;
  local_190._24_8_ = local_148;
  _kj_switch_subject.field_1.value.tag = 1;
  pEVar16 = local_198;
LAB_0039ec35:
  local_190._32_8_ = local_158;
  if (pEVar16 != (Exception *)0x0) {
    (**local_140->_vptr_ArrayDisposer)
              (local_140,pEVar16,0x28,((long)pEVar14 - (long)pEVar16 >> 3) * -0x3333333333333333,
               ((long)pEVar17 - (long)pEVar16 >> 3) * -0x3333333333333333,
               ArrayDisposer::
               Dispose_<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::destruct);
    _kj_switch_subject.field_1.value.tag = local_190._0_4_;
  }
  uVar7 = local_190._32_8_;
  uVar6 = local_190._24_8_;
  uVar5 = local_190._16_8_;
  pEVar14 = (Exception *)local_190._8_8_;
  _kj_switch_subject.isSet = true;
  if (_kj_switch_subject.field_1.value.tag == 2) {
    _kj_switch_subject.field_1._24_8_ = local_190._24_8_;
    _kj_switch_subject.field_1._8_8_ = local_190._8_8_;
    _kj_switch_subject.field_1._16_8_ = local_190._16_8_;
    OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
    ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
              *)local_190);
    __return_storage_ptr__->tag = 2;
    *(undefined8 *)&__return_storage_ptr__->field_1 = _kj_switch_subject.field_1._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = _kj_switch_subject.field_1._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         _kj_switch_subject.field_1._24_8_;
    OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
    ::~OneOf(&_kj_switch_subject.field_1.value);
    __return_storage_ptr__ = extraout_RAX;
  }
  else {
    if (_kj_switch_subject.field_1.value.tag == 1) {
      _kj_switch_subject.field_1._8_8_ = local_190._8_8_;
      _kj_switch_subject.field_1._16_8_ = local_190._16_8_;
      _kj_switch_subject.field_1._24_8_ = local_190._24_8_;
      _kj_switch_subject.field_1._32_8_ = local_190._32_8_;
      local_190._8_8_ = (Exception *)0x0;
      local_190._16_8_ = (Exception *)0x0;
      local_190._24_8_ = (Exception *)0x0;
      OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
      ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
                *)local_190);
      parts.builder.pos =
           (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)uVar5;
      parts.builder.endPtr = (Result *)uVar6;
      parts.builder.disposer = (ArrayDisposer *)uVar7;
      _kj_switch_subject.field_1._8_8_ = 0;
      _kj_switch_subject.field_1._16_8_ = 0;
      _kj_switch_subject.field_1._24_8_ = 0;
    }
    else {
      OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
      ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
                *)local_190);
      pEVar14 = (Exception *)0x0;
    }
    OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
    ::~OneOf(&_kj_switch_subject.field_1.value);
    lVar11 = 0;
    for (pEVar16 = pEVar14; pEVar16 != (Exception *)parts.builder.pos;
        pEVar16 = (Exception *)&pEVar16->description) {
      lVar11 = lVar11 + *(size_t *)&pEVar16->line;
    }
    elementCount = (ulong)addNullTerminator + lVar11;
    pvVar12 = kj::_::HeapArrayDisposer::allocateImpl
                        (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
    sVar19 = 0;
    for (pEVar16 = pEVar14; pEVar16 != (Exception *)parts.builder.pos;
        pEVar16 = (Exception *)&pEVar16->description) {
      memcpy((void *)((long)pvVar12 + sVar19),
             ((Array<const_unsigned_char> *)&(pEVar16->ownFile).content.size_)->ptr,
             *(size_t *)&pEVar16->line);
      sVar19 = sVar19 + *(size_t *)&pEVar16->line;
    }
    local_190._0_8_ = sVar19;
    if (addNullTerminator) {
      local_190._0_8_ = sVar19 + 1;
      *(undefined1 *)((long)pvVar12 + sVar19) = 0;
    }
    _kj_switch_subject._0_8_ = local_190;
    _kj_switch_subject.field_1._8_8_ = anon_var_dwarf_4cea5;
    _kj_switch_subject.field_1._16_8_ = 5;
    _kj_switch_subject.field_1._25_7_ = (undefined7)((ulong)_kj_switch_subject.field_1._24_8_ >> 8);
    _kj_switch_subject.field_1._24_1_ = local_190._0_8_ == elementCount;
    _kj_switch_subject.field_1._0_8_ = elementCount;
    if (local_190._0_8_ != elementCount) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xd00,FAILED,"currentIndex == processedMessage.size()","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_long> *)&_kj_switch_subject);
      kj::_::Debug::Fault::fatal(&f_1);
    }
    __return_storage_ptr__->tag = 1;
    *(void **)&__return_storage_ptr__->field_1 = pvVar12;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = elementCount;
    *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x10) =
         &kj::_::HeapArrayDisposer::instance;
    parts.builder.ptr = (Result *)pEVar14;
  }
  if ((Exception *)parts.builder.ptr != (Exception *)0x0) {
    iVar9 = (**(parts.builder.disposer)->_vptr_ArrayDisposer)
                      (parts.builder.disposer,parts.builder.ptr,0x28,
                       ((long)parts.builder.pos - (long)parts.builder.ptr >> 3) *
                       -0x3333333333333333,
                       ((long)parts.builder.endPtr - (long)parts.builder.ptr >> 3) *
                       -0x3333333333333333,
                       ArrayDisposer::
                       Dispose_<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::
                       destruct);
    __return_storage_ptr__ =
         (OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *)
         CONCAT44(extraout_var,iVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<kj::Array<kj::byte>, ProtocolError> processMessage(kj::ArrayPtr<const byte> message,
        kj::Maybe<size_t> maxSize = kj::none,
        bool addNullTerminator = false) {
      // If `this` is the compressor, calling `processMessage()` will compress the `message`.
      // Likewise, if `this` is the decompressor, `processMessage()` will decompress the `message`.
      //
      // `maxSize` is only passed in when decompressing, since we want to ensure the decompressed
      // message is smaller than the `maxSize` passed to `receive()`.
      //
      // If (de)compression is successful, the result is returned as a Vector, otherwise,
      // an Exception is thrown.

      ctx.next_in = const_cast<byte*>(reinterpret_cast<const byte*>(message.begin()));
      ctx.avail_in = message.size();

      kj::Vector<Result> parts;
      KJ_SWITCH_ONEOF(processLoop(maxSize)) {
        KJ_CASE_ONEOF(protocolError, ProtocolError) {
          return kj::mv(protocolError);
        }
        KJ_CASE_ONEOF(dataParts, kj::Vector<Result>) {
          parts = kj::mv(dataParts);
        }
      }

      size_t amountToAllocate = 0;
      for (const auto& part : parts) {
        amountToAllocate += part.size;
      }

      if (addNullTerminator) {
        // Add space for the null-terminator.
        amountToAllocate += 1;
      }

      kj::Array<kj::byte> processedMessage = kj::heapArray<kj::byte>(amountToAllocate);
      size_t currentIndex = 0; // Current index into processedMessage.
      for (const auto& part : parts) {
        memcpy(&processedMessage[currentIndex], part.buffer.begin(), part.size);
        // We need to use `part.size` to determine the number of useful bytes, since data after
        // `part.size` is unused (and probably junk).
        currentIndex += part.size;
      }

      if (addNullTerminator) {
        processedMessage[currentIndex++] = '\0';
      }

      KJ_ASSERT(currentIndex == processedMessage.size());

      return kj::mv(processedMessage);
    }